

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruleset.cpp
# Opt level: O2

void __thiscall Ruleset::rebuildRuleInstances(Ruleset *this)

{
  pointer ppRVar1;
  pointer ppVar2;
  bool bVar3;
  pointer ppVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*> pair
  ;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>
  local_78;
  string local_50;
  
  ppRVar1 = (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppRVar1) {
    (this->m_ruleInstances).super__Vector_base<Rule_*,_std::allocator<Rule_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppRVar1;
  }
  ppVar2 = (this->m_nameToRule).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (this->m_nameToRule).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar2; ppVar4 = ppVar4 + 1) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rule_*>::
    pair(&local_78,ppVar4);
    std::__cxx11::string::string((string *)&local_50,(string *)&local_78);
    bVar3 = isEnabled(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar3) {
      std::vector<Rule_*,_std::allocator<Rule_*>_>::push_back
                (&this->m_ruleInstances,&local_78.second);
    }
    std::__cxx11::string::~string((string *)&local_78);
  }
  return;
}

Assistant:

void Ruleset::rebuildRuleInstances(){
    m_ruleInstances.clear();
    for(const auto pair : m_nameToRule){
        if(isEnabled(pair.first)){
            m_ruleInstances.push_back(pair.second);
        }
    }
}